

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_temp_ext_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float __y;
  float fVar1;
  float *pfVar2;
  llama_token_data_array *in_RSI;
  long in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  size_t i_2;
  double p;
  size_t i_1;
  double cum_sum_double;
  double max_l_double;
  float dyn_temp;
  float normalized_entropy;
  float prob;
  size_t i;
  float entropy;
  float max_entropy;
  float exponent_val;
  float max_temp;
  float min_temp;
  llama_sampler_temp_ext *ctx;
  float local_7c;
  ulong local_78;
  llama_token_data_array *in_stack_ffffffffffffff90;
  ulong local_68;
  double local_60;
  ulong local_40;
  float local_34;
  float local_24;
  float local_20;
  float local_1c;
  float *local_18;
  llama_token_data_array *local_10;
  
  local_18 = *(float **)(in_RDI + 8);
  if (local_18[1] <= 0.0) {
    llama_sampler_temp_impl(in_RSI,*local_18);
  }
  else {
    local_20 = 0.0;
    local_24 = *local_18 - local_18[1];
    local_10 = in_RSI;
    pfVar2 = std::max<float>(&local_20,&local_24);
    local_1c = *pfVar2;
    fVar5 = *local_18;
    fVar6 = local_18[1];
    __y = local_18[2];
    if (1 < local_10->size) {
      local_7c = (float)local_10->size;
      fVar3 = logf(1.0 / local_7c);
      llama_sampler_softmax_impl(in_stack_ffffffffffffff90);
      local_34 = 0.0;
      for (local_40 = 0; fVar1 = local_1c, local_40 < local_10->size; local_40 = local_40 + 1) {
        fVar1 = local_10->data[local_40].p;
        if (0.0 < fVar1) {
          fVar4 = logf(fVar1);
          local_34 = -fVar1 * fVar4 + local_34;
        }
      }
      fVar5 = (fVar5 + fVar6) - local_1c;
      fVar6 = powf(local_34 / -fVar3,__y);
      llama_sampler_temp_impl(local_10,fVar5 * fVar6 + fVar1);
      fVar5 = local_10->data->logit;
      local_60 = 0.0;
      for (local_68 = 0; local_68 < local_10->size; local_68 = local_68 + 1) {
        dVar7 = exp((double)local_10->data[local_68].logit - (double)fVar5);
        local_10->data[local_68].p = (float)dVar7;
        local_60 = dVar7 + local_60;
      }
      for (local_78 = 0; local_78 < local_10->size; local_78 = local_78 + 1) {
        local_10->data[local_78].p = (float)((double)local_10->data[local_78].p / local_60);
      }
    }
  }
  return;
}

Assistant:

static void llama_sampler_temp_ext_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_temp_ext *) smpl->ctx;
    if (ctx->delta > 0) {
        const float min_temp = std::max(0.0f, ctx->temp - ctx->delta);
        const float max_temp = ctx->temp + ctx->delta;

        float exponent_val = ctx->exponent;

        // no need to do anything if there is only one (or zero) candidates
        if (cur_p->size <= 1) {
            return;
        }

        // Calculate maximum possible entropy
        float max_entropy = -logf(1.0f / cur_p->size);

        llama_sampler_softmax_impl(cur_p);

        // Calculate entropy of the softmax probabilities
        float entropy = 0.0f;
        for (size_t i = 0; i < cur_p->size; ++i) {
            float prob = cur_p->data[i].p;
            if (prob > 0.0f) { // Ensure no log(0)
                entropy -= prob * logf(prob);
            }
        }

        // Normalize the entropy (max_entropy cannot be 0 here because we checked cur_p->size != 1 above)
        float normalized_entropy = entropy / max_entropy;

        // Map the normalized entropy to the desired temperature range using the power function
        float dyn_temp = min_temp + (max_temp - min_temp) * powf(normalized_entropy, exponent_val);

    #ifdef DEBUG
        LLAMA_LOG_INFO("Your text maxtemp value is: %f\n", max_temp);
        LLAMA_LOG_INFO("Entropy: %f\n", entropy);
        LLAMA_LOG_INFO("Max Possible Entropy: %f\n", max_entropy);
        LLAMA_LOG_INFO("Normalized Entropy: %f\n", normalized_entropy);
        LLAMA_LOG_INFO("Exponent: %f\n", exponent_val);
        LLAMA_LOG_INFO("Dynamic Temperature (dyn_temp): %f\n", dyn_temp);
    #endif

        // Apply the dynamically calculated temperature scaling
        llama_sampler_temp_impl(cur_p, dyn_temp);

        // Re-compute softmax probabilities after scaling logits with dynamic temperature
        const double max_l_double = cur_p->data[0].logit;

        double cum_sum_double = 0.0;
        for (size_t i = 0; i < cur_p->size; ++i) {
            double p = exp(cur_p->data[i].logit - max_l_double);
            cur_p->data[i].p = p; // Store the scaled probability
            cum_sum_double += p;
        }

        for (size_t i = 0; i < cur_p->size; ++i) {
            cur_p->data[i].p /= cum_sum_double; // Re-normalize the probabilities
        }

    #ifdef DEBUG
        // Print the updated top 25 probabilities after temperature scaling
        LLAMA_LOG_INFO("\nUpdated Top 25 Probabilities After Dynamic Temperature Scaling (in percentages):\n");
        for (size_t i = 0; i < 25 && i < cur_p->size; ++i) {
            LLAMA_LOG_INFO("Token %zu: %f%%\n", i + 1, cur_p->data[i].p * 100.0f);
        }
    #endif
    } else {
        llama_sampler_temp_impl(cur_p, ctx->temp);
    }
}